

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

Var __thiscall
Js::InterpreterStackFrame::ProfileModulus<true>
          (InterpreterStackFrame *this,Var aLeft,Var aRight,ScriptContext *scriptContext,
          ProfileId profileId)

{
  code *pcVar1;
  bool bVar2;
  FunctionBody *this_00;
  DynamicProfileInfo *pDVar3;
  Var pvVar4;
  undefined4 *unaff_RBX;
  uint uVar5;
  
  this_00 = JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(this + 0x80));
  bVar2 = TaggedInt::IsPair(aLeft,aRight);
  if (bVar2) {
    if (((ulong)aLeft & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)aLeft & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      unaff_RBX = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *unaff_RBX = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) goto LAB_00a5b7b5;
      *unaff_RBX = 0;
    }
    if (((ulong)aLeft & 0xffff000000000000) != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      unaff_RBX = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *unaff_RBX = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x43,"(Is(aValue))","Ensure var is actually a \'TaggedInt\'");
      if (!bVar2) goto LAB_00a5b7b5;
      *unaff_RBX = 0;
    }
    if (((ulong)aRight & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)aRight & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      unaff_RBX = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *unaff_RBX = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) goto LAB_00a5b7b5;
      *unaff_RBX = 0;
    }
    if (((ulong)aRight & 0xffff000000000000) != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      unaff_RBX = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *unaff_RBX = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x43,"(Is(aValue))","Ensure var is actually a \'TaggedInt\'");
      if (!bVar2) {
LAB_00a5b7b5:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *unaff_RBX = 0;
    }
    bVar2 = true;
    if (((0 < (int)(uint)aLeft) && (uVar5 = (uint)aRight, 0 < (int)uVar5)) &&
       ((uVar5 + 0x7fffffff & uVar5) == 0)) {
      pDVar3 = FunctionBody::GetDynamicProfileInfo(this_00);
      DynamicProfileInfo::RecordModulusOpType(pDVar3,this_00,profileId,true);
      unaff_RBX = (undefined4 *)((ulong)(uVar5 - 1 & (uint)aLeft & 0x7fffffff) | 0x1000000000000);
      bVar2 = false;
    }
    if (!bVar2) {
      bVar2 = false;
      goto LAB_00a5b782;
    }
  }
  pDVar3 = FunctionBody::GetDynamicProfileInfo(this_00);
  DynamicProfileInfo::RecordModulusOpType(pDVar3,this_00,profileId,false);
  bVar2 = true;
LAB_00a5b782:
  if (!bVar2) {
    return unaff_RBX;
  }
  pvVar4 = JavascriptMath::Modulus_Full(aLeft,aRight,scriptContext);
  return pvVar4;
}

Assistant:

Var InterpreterStackFrame::ProfileModulus(Var aLeft, Var aRight, ScriptContext* scriptContext, ProfileId profileId)
    {
        // If both arguments are TaggedInt, then try to do integer division
            // This case is not handled by the lowerer.
        if (doProfile)
        {
            Js::FunctionBody* body = this->function->GetFunctionBody();
            if (TaggedInt::IsPair(aLeft, aRight))
            {
                int nLeft = TaggedInt::ToInt32(aLeft);
                int nRight = TaggedInt::ToInt32(aRight);

                // nLeft is positive and nRight is +2^i
                // Fast path for Power of 2 divisor
                if (nLeft > 0 && ::Math::IsPow2(nRight))
                {
                    body->GetDynamicProfileInfo()->RecordModulusOpType(body, profileId, /*isModByPowerOf2*/ true);
                    return TaggedInt::ToVarUnchecked(nLeft & (nRight - 1));
                }
            }
            body->GetDynamicProfileInfo()->RecordModulusOpType(body, profileId, /*isModByPowerOf2*/ false);
        }

        return JavascriptMath::Modulus(aLeft, aRight, scriptContext);
    }